

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  char *pcVar1;
  char *in_RDX;
  undefined1 in_SIL;
  long *in_RDI;
  const_pointer result;
  size_type local_38;
  undefined7 in_stack_ffffffffffffffe8;
  size_type local_8;
  
  if ((in_RDI[1] == 0) || ((char *)in_RDI[1] <= in_RDX)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    pcVar1 = std::find<char_const*,char>
                       ((char *)in_RDI,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),in_RDX);
    if (pcVar1 == (char *)(*in_RDI + in_RDI[1])) {
      local_38 = 0xffffffffffffffff;
    }
    else {
      local_38 = (long)pcVar1 - *in_RDI;
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

StringPiece::size_type StringPiece::find(char c, size_type pos) const {
  if (size_ <= 0 || pos >= size_) return npos;
  const_pointer result = std::find(data_ + pos, data_ + size_, c);
  return result != data_ + size_ ? result - data_ : npos;
}